

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd1D.c
# Opt level: O0

void run_1D_fdtd(fdtd1D *fdtd,float_type end_time,_Bool verbose)

{
  undefined1 auVar1 [16];
  time_measure t1;
  time_measure t0;
  long lVar2;
  byte in_SIL;
  fdtd1D *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double difference;
  time_measure tend_chunk;
  time_measure tstart_chunk;
  double percentage;
  size_t iter_count;
  size_t inter_print;
  double percent_increment;
  size_t print_interval;
  double divide;
  double print_interval_d;
  double num_iter_d;
  long local_a8;
  fdtd1D *in_stack_ffffffffffffff60;
  __time_t in_stack_ffffffffffffff68;
  __syscall_slong_t in_stack_ffffffffffffff70;
  __time_t in_stack_ffffffffffffff78;
  __syscall_slong_t in_stack_ffffffffffffff80;
  double local_78;
  long local_70;
  double local_50;
  double local_48;
  
  auVar4._0_8_ = (in_XMM0_Qa - in_RDI->time) / in_RDI->dt;
  auVar4._8_8_ = 0;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = auVar4._0_8_;
  auVar4 = vroundsd_avx(auVar4,auVar6,10);
  dVar3 = auVar4._0_8_;
  if (dVar3 < 10.0) {
    local_48 = 1.0;
  }
  else {
    local_50 = 1.0;
    do {
      auVar5._0_8_ = dVar3 / local_50;
      auVar5._8_8_ = 0;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = auVar5._0_8_;
      auVar4 = vroundsd_avx(auVar5,auVar7,10);
      local_48 = auVar4._0_8_;
      local_50 = local_50 + 1.0;
    } while (dVar3 / local_48 < 10.0);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_48;
  lVar2 = vcvttsd2usi_avx512f(auVar1);
  dVar3 = 100.0 / (dVar3 / local_48);
  local_70 = 0;
  clock_gettime(4,(timespec *)&stack0xffffffffffffff78);
  local_78 = dVar3;
  while (in_RDI->time < in_XMM0_Qa) {
    update_magnetic_field(in_RDI);
    apply_M_sources(in_stack_ffffffffffffff60);
    border_condition_magnetic(in_RDI);
    update_electric_field(in_RDI);
    apply_J_sources(in_stack_ffffffffffffff60);
    border_condition_electric(in_RDI);
    if (local_70 == lVar2 + -1) {
      local_a8 = 0;
    }
    else {
      local_a8 = local_70 + 1;
    }
    local_70 = local_a8;
    if (((in_SIL & 1) != 0) && (local_a8 == 0)) {
      clock_gettime(4,(timespec *)&stack0xffffffffffffff68);
      t0.tv_nsec = in_stack_ffffffffffffff80;
      t0.tv_sec = in_stack_ffffffffffffff78;
      t1.tv_nsec = in_stack_ffffffffffffff70;
      t1.tv_sec = in_stack_ffffffffffffff68;
      in_stack_ffffffffffffff60 = (fdtd1D *)measuring_difftime(t0,t1);
      printf("%.0f%% -- t=%e dt=%e tend=%e (%zu iter in %.3fs)\n",local_78,in_RDI->time,in_RDI->dt,
             in_XMM0_Qa,in_stack_ffffffffffffff60,lVar2);
      local_78 = dVar3 + local_78;
      in_stack_ffffffffffffff78 = in_stack_ffffffffffffff68;
      in_stack_ffffffffffffff80 = in_stack_ffffffffffffff70;
    }
    in_RDI->time = in_RDI->dt + in_RDI->time;
  }
  return;
}

Assistant:

void run_1D_fdtd(struct fdtd1D *fdtd, float_type end_time, bool verbose) {
  const double num_iter_d = ceil((end_time - fdtd->time) / fdtd->dt);
  double print_interval_d;
  if (num_iter_d >= 10.) {
    double divide = 1.;
    do {
      print_interval_d = ceil(num_iter_d / divide);
      divide = divide + 1.;
    } while (num_iter_d / print_interval_d < 10.);
  } else {
    print_interval_d = 1.;
  }
  const size_t print_interval = (size_t)print_interval_d;
  const double percent_increment = 100. / (num_iter_d / print_interval_d);
  const size_t inter_print = print_interval - 1;
  size_t iter_count = 0;
  double percentage = percent_increment;
  time_measure tstart_chunk, tend_chunk;
  get_current_time(&tstart_chunk);
  for (; fdtd->time < end_time; fdtd->time += fdtd->dt) {
    update_magnetic_field(fdtd);
    apply_M_sources(fdtd);
    border_condition_magnetic(fdtd);

    update_electric_field(fdtd);
    apply_J_sources(fdtd);
    border_condition_electric(fdtd);

    iter_count = iter_count == inter_print ? 0 : iter_count + 1;
    if (verbose && iter_count == 0) {
      get_current_time(&tend_chunk);
      double difference = measuring_difftime(tstart_chunk, tend_chunk);
      printf("%.0f%% -- t=%e dt=%e tend=%e (%zu iter in %.3fs)\n", percentage,
             fdtd->time, fdtd->dt, end_time, print_interval, difference);
      percentage += percent_increment;
      tstart_chunk = tend_chunk;
    }
  }
}